

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = (other->assertions).failed;
  sVar2 = (this->testCases).passed;
  sVar3 = (this->testCases).failed;
  sVar4 = (this->testCases).failedButOk;
  (this->assertions).passed = (this->assertions).passed + (other->assertions).passed;
  (this->assertions).failed = (this->assertions).failed + sVar1;
  sVar1 = (other->testCases).passed;
  (this->assertions).failedButOk = (other->assertions).failedButOk + (this->assertions).failedButOk;
  (this->testCases).passed = sVar1 + sVar2;
  sVar1 = (other->testCases).failedButOk;
  (this->testCases).failed = (other->testCases).failed + sVar3;
  (this->testCases).failedButOk = sVar1 + sVar4;
  return this;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }